

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

Enum xatlas::AddUvMesh(Atlas *atlas,UvMeshDecl *decl)

{
  ArrayBase *this;
  uint8_t *puVar1;
  ulong uVar2;
  uint uVar3;
  Enum EVar4;
  void *pvVar5;
  uint8_t *puVar6;
  uint32_t *puVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  void *pvVar10;
  bool bVar11;
  bool bVar12;
  long *plVar13;
  undefined8 *puVar14;
  ArrayBase *pAVar15;
  uint32_t uVar16;
  uint uVar17;
  ulong uVar18;
  char *__function;
  Enum EVar19;
  Atlas *pAVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uint32_t j;
  uint32_t i;
  long lVar24;
  int iVar25;
  uint32_t face2;
  UvMeshChart *chart;
  UvMeshInstance *meshInstance;
  HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
  vertexToFaceMap;
  BitArray faceAssigned;
  uint local_104;
  long *local_100;
  uint local_f4;
  ArrayBase *local_f0;
  UvMeshDecl *local_e8;
  ulong local_e0;
  Atlas *local_d8;
  uint local_cc;
  ArrayBase *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  ArrayBase *local_b0;
  ulong local_a8;
  long *local_a0;
  HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
  local_98;
  BitArray local_50;
  
  if (atlas == (Atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x22bb,"AddMeshError::Enum xatlas::AddUvMesh(Atlas *, const UvMeshDecl &)");
  }
  if (atlas[1].width == 0) {
    uVar18 = (ulong)decl->indexCount;
    uVar17 = decl->indexCount;
    if (uVar18 == 0) {
      uVar17 = decl->vertexCount;
    }
    uVar21 = (ulong)uVar17;
    if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == 1)) {
      (*(code *)internal::s_print)
                ("Adding UV mesh %d: %u vertices, %u triangles\n",
                 *(undefined4 *)&atlas[4].field_0x14,decl->vertexCount,uVar21 / 3);
    }
    EVar19 = InvalidIndexCount;
    if (uVar17 * -0x55555555 < 0x55555556) {
      if (uVar17 != 0 && uVar18 != 0) {
        pvVar5 = decl->indexData;
        if (pvVar5 == (void *)0x0) {
LAB_001a2977:
          __assert_fail("indexData",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x2203,
                        "uint32_t xatlas::DecodeIndex(IndexFormat::Enum, const void *, int32_t, uint32_t)"
                       );
        }
        uVar22 = 0;
        do {
          if (decl->indexFormat == UInt16) {
            uVar23 = (uint)(ushort)(*(short *)((long)pvVar5 + uVar22 * 2) + (short)decl->indexOffset
                                   );
          }
          else {
            uVar23 = *(int *)((long)pvVar5 + uVar22 * 4) + decl->indexOffset;
          }
          if (decl->vertexCount <= uVar23) {
            return IndexOutOfRange;
          }
          uVar22 = uVar22 + 1;
        } while (uVar18 != uVar22);
      }
      plVar13 = (long *)(*(code *)internal::s_realloc)(0,0x28);
      if (plVar13 != (long *)0x0) {
        pAVar15 = (ArrayBase *)(plVar13 + 1);
        plVar13[2] = 0;
        plVar13[3] = 0;
        *plVar13 = 0;
        plVar13[1] = 0;
        plVar13[4] = 0;
        *(undefined4 *)(plVar13 + 2) = 8;
        *(undefined4 *)(plVar13 + 3) = 0;
        uVar16 = decl->vertexCount;
        *(uint32_t *)((long)plVar13 + 0x14) = uVar16;
        local_100 = plVar13;
        local_e0 = uVar21;
        local_a0 = plVar13;
        if (uVar16 != 0) {
          internal::ArrayBase::setArrayCapacity(pAVar15,uVar16);
          uVar23 = decl->vertexCount;
          if ((ulong)uVar23 != 0) {
            uVar3 = *(uint *)((long)local_100 + 0x14);
            pvVar5 = decl->vertexUvData;
            uVar16 = decl->vertexStride;
            uVar21 = 0;
            uVar22 = 0;
            do {
              if (uVar3 == uVar22) goto LAB_001a2958;
              uVar2 = *(ulong *)((long)pvVar5 + uVar21);
              iVar25 = -(uint)(NAN((float)uVar2) || NAN((float)(uVar2 >> 0x20)));
              *(ulong *)(pAVar15->buffer + uVar22 * 8) = ~CONCAT44(iVar25,iVar25) & uVar2;
              uVar22 = uVar22 + 1;
              uVar21 = (ulong)((int)uVar21 + uVar16);
            } while (uVar23 != uVar22);
          }
        }
        *(bool *)(local_100 + 4) = decl->rotateCharts;
        local_c8 = (ArrayBase *)&atlas[4].atlasCount;
        uVar23 = *(uint *)&atlas[4].field_0x14;
        local_e8 = decl;
        local_d8 = atlas;
        if ((ulong)uVar23 != 0) {
          lVar24 = *(long *)local_c8;
          uVar21 = 0;
          do {
            puVar14 = *(undefined8 **)(lVar24 + uVar21 * 8);
            iVar25 = bcmp(puVar14,local_e8,0x38);
            pAVar20 = local_d8;
            plVar13 = local_100;
            if (iVar25 == 0) {
              *local_100 = (long)puVar14;
              local_b8 = puVar14;
              if (puVar14 != (undefined8 *)0x0) {
                if (internal::s_print == (undefined *)0x0) goto LAB_001a26a6;
                if (internal::s_printVerbose != 1) goto LAB_001a2691;
                (*(code *)internal::s_print)("   instance of a previous UV mesh\n");
                goto LAB_001a267f;
              }
              break;
            }
            uVar21 = uVar21 + 1;
          } while (uVar23 != uVar21);
        }
        puVar14 = (undefined8 *)(*(code *)internal::s_realloc)(0,0x80);
        uVar21 = local_e0;
        if (puVar14 != (undefined8 *)0x0) {
          puVar14[6] = 0;
          puVar14[7] = 0;
          puVar14[8] = 0;
          puVar14[9] = 0;
          puVar14[10] = 0;
          puVar14[0xb] = 0;
          puVar14[0xc] = 0;
          puVar14[0xd] = 0;
          puVar14[0xe] = 0;
          puVar14[0xf] = 0;
          puVar14[4] = 0;
          puVar14[5] = 0;
          puVar14[2] = 0;
          puVar14[3] = 0;
          *puVar14 = 0;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 6) = 1;
          this = (ArrayBase *)(puVar14 + 7);
          *(undefined4 *)(puVar14 + 8) = 4;
          *(undefined4 *)(puVar14 + 9) = 0;
          *(undefined4 *)(puVar14 + 0xb) = 8;
          *(undefined4 *)(puVar14 + 0xc) = 0;
          *(undefined4 *)(puVar14 + 0xe) = 4;
          *(undefined4 *)(puVar14 + 0xf) = 0;
          *local_100 = (long)puVar14;
          *(bool *)(puVar14 + 6) = local_e8->rotateCharts;
          uVar8 = *(undefined8 *)local_e8;
          pvVar5 = local_e8->vertexUvData;
          uVar9 = *(undefined8 *)&local_e8->indexCount;
          pvVar10 = local_e8->indexData;
          puVar7 = local_e8->faceMaterialData;
          puVar14[4] = *(undefined8 *)&local_e8->indexOffset;
          puVar14[5] = puVar7;
          puVar14[2] = uVar9;
          puVar14[3] = pvVar10;
          *puVar14 = uVar8;
          puVar14[1] = pvVar5;
          uVar16 = local_e8->indexCount;
          *(uint32_t *)((long)puVar14 + 0x44) = uVar16;
          local_b8 = puVar14;
          if (uVar16 != 0) {
            internal::ArrayBase::setArrayCapacity(this,uVar16);
          }
          if (uVar17 != 0) {
            pvVar5 = local_e8->indexData;
            EVar4 = local_e8->indexFormat;
            uVar22 = 0;
            do {
              if (uVar18 == 0) {
                uVar23 = (uint)uVar22;
              }
              else {
                if (pvVar5 == (void *)0x0) goto LAB_001a2977;
                if (EVar4 == UInt16) {
                  uVar23 = (uint)(ushort)((short)local_e8->indexOffset +
                                         *(short *)((long)pvVar5 + uVar22 * 2));
                }
                else {
                  uVar23 = local_e8->indexOffset + *(int *)((long)pvVar5 + uVar22 * 4);
                }
              }
              if (*(uint *)((long)puVar14 + 0x44) <= uVar22) goto LAB_001a2941;
              *(uint *)(this->buffer + uVar22 * 4) = uVar23;
              uVar22 = uVar22 + 1;
            } while (uVar21 != uVar22);
          }
          uVar23 = local_e8->vertexCount;
          *(uint *)((long)puVar14 + 0x74) = uVar23;
          if (*(uint *)(puVar14 + 0xf) < uVar23) {
            internal::ArrayBase::setArrayCapacity((ArrayBase *)(puVar14 + 0xd),uVar23);
            uVar23 = *(uint *)((long)puVar14 + 0x74);
          }
          plVar13 = local_100;
          if (uVar23 != 0) {
            puVar6 = ((ArrayBase *)(puVar14 + 0xd))->buffer;
            uVar18 = 0;
            do {
              puVar1 = puVar6 + uVar18 * 4;
              puVar1[0] = 0xff;
              puVar1[1] = 0xff;
              puVar1[2] = 0xff;
              puVar1[3] = 0xff;
              uVar18 = uVar18 + 1;
            } while (uVar18 < *(uint *)((long)puVar14 + 0x74));
          }
          local_98.m_memTag = 0;
          local_98.m_numSlots = 0;
          local_98.m_slots = (uint32_t *)0x0;
          local_98.m_keys.m_base.buffer = (uint8_t *)0x0;
          local_98.m_keys.m_base.elementSize = 8;
          local_98.m_keys.m_base.size = 0;
          local_98.m_keys.m_base.capacity = 0;
          local_98.m_next.m_base.buffer = (uint8_t *)0x0;
          local_98.m_next.m_base.elementSize = 4;
          local_98.m_next.m_base.size = 0;
          local_98.m_next.m_base.capacity = 0;
          local_98.m_size = uVar17;
          if (uVar17 != 0) {
            uVar18 = 0;
            do {
              if (*(uint *)((long)puVar14 + 0x44) <= uVar18) goto LAB_001a2941;
              if (*(uint *)((long)plVar13 + 0x14) <= *(uint *)(this->buffer + uVar18 * 4))
              goto LAB_001a2958;
              internal::
              HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
              ::add(&local_98,
                    (Vector2 *)(pAVar15->buffer + (ulong)*(uint *)(this->buffer + uVar18 * 4) * 8));
              uVar18 = uVar18 + 1;
            } while (local_e0 != uVar18);
          }
          uVar18 = local_e0 * 0xaaaaaaab >> 0x21;
          local_c0 = puVar14;
          internal::BitArray::BitArray(&local_50,(uint)(local_e0 * 0xaaaaaaab >> 0x21));
          memset(local_50.m_wordArray.m_base.buffer,0,
                 (ulong)(local_50.m_wordArray.m_base.size * local_50.m_wordArray.m_base.elementSize)
                );
          local_f4 = 0;
          pAVar20 = local_d8;
          if (2 < uVar17) {
            local_b0 = (ArrayBase *)(local_c0 + 10);
            local_a8 = uVar18;
            do {
              bVar11 = internal::BitArray::get(&local_50,local_f4);
              if (!bVar11) {
                pAVar15 = (ArrayBase *)(*(code *)internal::s_realloc)(0,0x38);
                if (pAVar15 == (ArrayBase *)0x0) goto LAB_001a29b5;
                pAVar15->buffer = (uint8_t *)0x0;
                pAVar15->elementSize = 0;
                pAVar15->size = 0;
                *(undefined8 *)&pAVar15->capacity = 0;
                pAVar15[1].buffer = (uint8_t *)0x0;
                pAVar15[1].elementSize = 0;
                pAVar15[1].size = 0;
                *(undefined8 *)&pAVar15[1].capacity = 0;
                pAVar15[2].buffer = (uint8_t *)0x0;
                pAVar15->elementSize = 4;
                uVar16 = 0;
                pAVar15->capacity = 0;
                pAVar15[1].elementSize = 4;
                pAVar15[1].capacity = 0;
                if (local_e8->faceMaterialData != (uint32_t *)0x0) {
                  uVar16 = local_e8->faceMaterialData[local_f4];
                }
                *(uint32_t *)&pAVar15[2].buffer = uVar16;
                local_f0 = pAVar15;
                internal::BitArray::set(&local_50,local_f4);
                internal::ArrayBase::push_back(local_f0,(uint8_t *)&local_f4);
                do {
                  local_cc = local_f0->size;
                  if (local_cc == 0) goto LAB_001a290d;
                  uVar18 = 0;
                  bVar11 = false;
                  do {
                    if (local_f0->size <= (uint)uVar18) goto LAB_001a2941;
                    uVar17 = *(uint *)(local_f0->buffer + uVar18 * 4);
                    local_e0 = (ulong)(uVar17 * 3);
                    lVar24 = 0;
                    do {
                      uVar23 = (int)local_e0 + (int)lVar24;
                      if (*(uint *)(*local_100 + 0x44) <= uVar23) goto LAB_001a2941;
                      uVar23 = *(uint *)(*(long *)(*local_100 + 0x38) + (ulong)uVar23 * 4);
                      if (*(uint *)((long)local_100 + 0x14) <= uVar23) goto LAB_001a2958;
                      uVar23 = internal::
                               HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
                               ::get(&local_98,(Vector2 *)((ulong)uVar23 * 8 + local_100[1]));
                      plVar13 = local_100;
                      while (local_100 = plVar13, uVar23 != 0xffffffff) {
                        local_104 = uVar23 / 3;
                        bVar12 = internal::BitArray::get(&local_50,local_104);
                        if (!bVar12) {
                          puVar7 = local_e8->faceMaterialData;
                          if ((puVar7 == (uint32_t *)0x0) || (puVar7[uVar17] == puVar7[local_104]))
                          {
                            internal::BitArray::set(&local_50,local_104);
                            bVar11 = true;
                            internal::ArrayBase::push_back(local_f0,(uint8_t *)&local_104);
                          }
                        }
                        uVar23 = internal::
                                 HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
                                 ::getNext(&local_98,uVar23);
                        plVar13 = local_100;
                      }
                      lVar24 = lVar24 + 1;
                    } while (lVar24 != 3);
                    uVar17 = (uint)uVar18 + 1;
                    uVar18 = (ulong)uVar17;
                  } while (uVar17 != local_cc);
                } while (bVar11);
                if (local_f0->size != 0) {
                  uVar18 = 0;
                  do {
                    iVar25 = 0;
                    do {
                      if (local_f0->size <= uVar18) goto LAB_001a2941;
                      uVar17 = *(int *)(local_f0->buffer + uVar18 * 4) * 3 + iVar25;
                      if (*(uint *)(*plVar13 + 0x44) <= uVar17) goto LAB_001a2941;
                      local_104 = *(uint *)(*(long *)(*plVar13 + 0x38) + (ulong)uVar17 * 4);
                      internal::ArrayBase::push_back(local_f0 + 1,(uint8_t *)&local_104);
                      if (*(uint *)((long)local_c0 + 0x74) <= local_104) goto LAB_001a2941;
                      *(undefined4 *)(local_c0[0xd] + (ulong)local_104 * 4) =
                           *(undefined4 *)((long)local_c0 + 0x5c);
                      iVar25 = iVar25 + 1;
                    } while (iVar25 != 3);
                    uVar18 = uVar18 + 1;
                  } while (uVar18 < local_f0->size);
                }
LAB_001a290d:
                internal::ArrayBase::push_back(local_b0,(uint8_t *)&local_f0);
                pAVar20 = local_d8;
                uVar18 = local_a8;
              }
              local_f4 = local_f4 + 1;
            } while (local_f4 < (uint)uVar18);
          }
          internal::ArrayBase::push_back(local_c8,(uint8_t *)&local_b8);
          internal::ArrayBase::~ArrayBase(&local_50.m_wordArray.m_base);
          internal::
          HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
          ::~HashMap(&local_98);
LAB_001a267f:
          if (internal::s_print != (undefined *)0x0) {
LAB_001a2691:
            if ((internal::s_printVerbose & 1) != 0) {
              (*(code *)internal::s_print)("   %u charts\n",*(undefined4 *)(*plVar13 + 0x5c));
            }
          }
LAB_001a26a6:
          internal::ArrayBase::push_back((ArrayBase *)&pAVar20[4].utilization,(uint8_t *)&local_a0);
          return Success;
        }
      }
LAB_001a29b5:
      __assert_fail("mem",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                    ,0x154,"void *xatlas::internal::Realloc(void *, size_t, int, const char *, int)"
                   );
    }
  }
  else {
    EVar19 = Error;
    if (internal::s_print != (undefined *)0x0) {
      (*(code *)internal::s_print)
                ("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
    }
  }
  return EVar19;
LAB_001a2958:
  __function = 
  "T &xatlas::internal::Array<xatlas::internal::Vector2>::operator[](uint32_t) [T = xatlas::internal::Vector2]"
  ;
  goto LAB_001a296d;
LAB_001a2941:
  __function = "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
LAB_001a296d:
  __assert_fail("index < m_base.size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x4ae,__function);
}

Assistant:

AddMeshError::Enum AddUvMesh(Atlas *atlas, const UvMeshDecl &decl)
{
	XA_DEBUG_ASSERT(atlas);
	if (!atlas) {
		XA_PRINT_WARNING("AddUvMesh: atlas is null.\n");
		return AddMeshError::Error;
	}
	Context *ctx = (Context *)atlas;
	if (ctx->meshCount > 0) {
		XA_PRINT_WARNING("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
		return AddMeshError::Error;
	}
	const bool decoded = (decl.indexCount <= 0);
	const uint32_t indexCount = decoded ? decl.vertexCount : decl.indexCount;
	XA_PRINT("Adding UV mesh %d: %u vertices, %u triangles\n", ctx->uvMeshes.size(), decl.vertexCount, indexCount / 3);
	// Expecting triangle faces.
	if ((indexCount % 3) != 0)
		return AddMeshError::InvalidIndexCount;
	if (!decoded) {
		// Check if any index is out of range.
		for (uint32_t i = 0; i < indexCount; i++) {
			const uint32_t index = DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i);
			if (index >= decl.vertexCount)
				return AddMeshError::IndexOutOfRange;
		}
	}
	internal::UvMeshInstance *meshInstance = XA_NEW(internal::MemTag::Default, internal::UvMeshInstance);
	meshInstance->texcoords.resize(decl.vertexCount);
	for (uint32_t i = 0; i < decl.vertexCount; i++) {
		internal::Vector2 texcoord = *((const internal::Vector2 *)&((const uint8_t *)decl.vertexUvData)[decl.vertexStride * i]);
		// Set nan values to 0.
		if (internal::isNan(texcoord.x) || internal::isNan(texcoord.y))
			texcoord.x = texcoord.y = 0.0f;
		meshInstance->texcoords[i] = texcoord;
	}
	meshInstance->rotateCharts = decl.rotateCharts;
	// See if this is an instance of an already existing mesh.
	internal::UvMesh *mesh = nullptr;
	for (uint32_t m = 0; m < ctx->uvMeshes.size(); m++) {
		if (memcmp(&ctx->uvMeshes[m]->decl, &decl, sizeof(UvMeshDecl)) == 0) {
			meshInstance->mesh = mesh = ctx->uvMeshes[m];
			break;
		}
	}
	if (!mesh) {
		// Copy geometry to mesh.
		meshInstance->mesh = mesh = XA_NEW(internal::MemTag::Default, internal::UvMesh);
		mesh->decl = decl;
		mesh->indices.resize(decl.indexCount);
		for (uint32_t i = 0; i < indexCount; i++)
			mesh->indices[i] = decoded ? i : DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i);
		mesh->vertexToChartMap.resize(decl.vertexCount);
		for (uint32_t i = 0; i < mesh->vertexToChartMap.size(); i++)
			mesh->vertexToChartMap[i] = UINT32_MAX;
		// Calculate charts (incident faces).
		internal::HashMap<internal::Vector2> vertexToFaceMap(internal::MemTag::Default, indexCount); // Face is index / 3
		const uint32_t faceCount = indexCount / 3;
		for (uint32_t i = 0; i < indexCount; i++)
			vertexToFaceMap.add(meshInstance->texcoords[mesh->indices[i]]);
		internal::BitArray faceAssigned(faceCount);
		faceAssigned.zeroOutMemory();
		for (uint32_t f = 0; f < faceCount; f++) {
			if (faceAssigned.get(f))
				continue;
			// Found an unassigned face, create a new chart.
			internal::UvMeshChart *chart = XA_NEW(internal::MemTag::Default, internal::UvMeshChart);
			chart->material = decl.faceMaterialData ? decl.faceMaterialData[f] : 0;
			// Walk incident faces and assign them to the chart.
			faceAssigned.set(f);
			chart->faces.push_back(f);
			for (;;) {
				bool newFaceAssigned = false;
				const uint32_t faceCount2 = chart->faces.size();
				for (uint32_t f2 = 0; f2 < faceCount2; f2++) {
					const uint32_t face = chart->faces[f2];
					for (uint32_t i = 0; i < 3; i++) {
						const internal::Vector2 &texcoord = meshInstance->texcoords[meshInstance->mesh->indices[face * 3 + i]];
						uint32_t mapIndex = vertexToFaceMap.get(texcoord);
						while (mapIndex != UINT32_MAX) {
							const uint32_t face2 = mapIndex / 3; // 3 vertices added per face.
							// Materials must match.
							if (!faceAssigned.get(face2) && (!decl.faceMaterialData || decl.faceMaterialData[face] == decl.faceMaterialData[face2])) {
								faceAssigned.set(face2);
								chart->faces.push_back(face2);
								newFaceAssigned = true;
							}
							mapIndex = vertexToFaceMap.getNext(mapIndex);
						}
					}
				}
				if (!newFaceAssigned)
					break;
			}
			for (uint32_t i = 0; i < chart->faces.size(); i++) {
				for (uint32_t j = 0; j < 3; j++) {
					const uint32_t vertex = meshInstance->mesh->indices[chart->faces[i] * 3 + j];
					chart->indices.push_back(vertex);
					mesh->vertexToChartMap[vertex] = mesh->charts.size();
				}
			}
			mesh->charts.push_back(chart);
		}
		ctx->uvMeshes.push_back(mesh);
	} else {
		XA_PRINT("   instance of a previous UV mesh\n");
	}
	XA_PRINT("   %u charts\n", meshInstance->mesh->charts.size());
	ctx->uvMeshInstances.push_back(meshInstance);
	return AddMeshError::Success;
}